

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer *ppbVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  ostream *poVar8;
  long lVar9;
  _List_node_base *p_Var10;
  char **ppcVar11;
  ParserBase PVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar14;
  bool showHelp;
  uint32_t minutes;
  uint64_t permutations;
  uint32_t hours;
  uint64_t start;
  list<std::thread,_std::allocator<std::thread>_> threadList;
  InternalParseResult result;
  RuntimePtr runtime;
  BufferPtr bytecode;
  Parser parser;
  bool local_68d;
  uint local_68c;
  _func_int *local_688;
  uint local_67c;
  char **local_678;
  _func_int *local_670;
  code *local_668;
  undefined8 local_660;
  _func_int *local_658;
  _func_int **local_650;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_648;
  long *local_640 [2];
  long local_630 [2];
  value_type local_620;
  string local_600;
  long *local_5e0 [2];
  long local_5d0 [2];
  value_type local_5c0;
  value_type local_5a0;
  string local_580;
  long *local_560 [2];
  long local_550 [2];
  value_type local_540;
  value_type local_520;
  string local_500;
  long *local_4e0 [2];
  long local_4d0 [2];
  value_type local_4c0;
  value_type local_4a0;
  string local_480;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  _Any_data local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3b8;
  _Alloc_hider _Stack_3a8;
  undefined1 local_3a0 [24];
  undefined1 auStack_388 [24];
  _Manager_type local_370;
  _Invoker_type p_Stack_368;
  uint32_t local_360;
  bool local_35c;
  undefined1 local_358 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider local_318;
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  long *local_2e0 [2];
  long local_2d0 [2];
  value_type local_2c0;
  undefined1 local_2a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  undefined1 local_228 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  Parser local_1b0;
  Parser local_150;
  Parser local_f0;
  Parser local_90;
  
  local_688 = (_func_int *)0x0;
  local_658 = (_func_int *)0x0;
  local_68c = 0;
  local_67c = 0;
  local_68d = false;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"permutations","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_long>
            ((ParserRefImpl<clara::detail::Opt> *)&local_3e8,(unsigned_long *)&local_688,&local_480)
  ;
  local_3e8._M_unused._M_object = &PTR__Opt_00153280;
  auStack_388._0_8_ = (pointer)0x0;
  auStack_388._8_8_ = (pointer)0x0;
  auStack_388._16_8_ = (pointer)0x0;
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"-p","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_388,&local_4a0);
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"--permutations","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_388,&local_4c0);
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e0,"Max number of permutations to run","");
  std::__cxx11::string::_M_assign((string *)&_Stack_3a8);
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"start","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_long>
            ((ParserRefImpl<clara::detail::Opt> *)local_358,(unsigned_long *)&local_658,&local_500);
  local_358._0_8_ = &PTR__Opt_00153280;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"-s","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_2f8,&local_520);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"--start","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_2f8,&local_540);
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"Starting permutation","");
  std::__cxx11::string::_M_assign((string *)&local_318);
  clara::detail::ComposableParserImpl<clara::detail::Opt>::operator|
            (&local_f0,(ComposableParserImpl<clara::detail::Opt> *)&local_3e8,(Opt *)local_358);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"minutes","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<clara::detail::Opt> *)local_460,&local_68c,&local_580);
  local_460._0_8_ = &PTR__Opt_00153280;
  local_400.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_400.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_400.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"-m","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_400,&local_5a0);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"--minutes","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_400,&local_5c0);
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e0,"Minutes to run fuzz tests","");
  std::__cxx11::string::_M_assign((string *)&local_420);
  clara::detail::Parser::operator|(&local_90,&local_f0,(Opt *)local_460);
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"hours","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<clara::detail::Opt> *)local_2a0,&local_67c,&local_600);
  local_2a0._0_8_ = &PTR__Opt_00153280;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"-h","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_240,&local_2c0);
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"--hours","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_240,&local_620);
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"Hours to run fuzz tests","");
  std::__cxx11::string::_M_assign((string *)&local_260);
  clara::detail::Parser::operator|(&local_1b0,&local_90,(Opt *)local_2a0);
  clara::detail::Help::Help((Help *)local_228,&local_68d);
  local_670 = (_func_int *)CONCAT44(local_670._4_4_,argc);
  local_678 = argv;
  clara::detail::Parser::operator|(&local_150,&local_1b0,(Help *)local_228);
  local_228._0_8_ = &PTR__Opt_00153280;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  local_228._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_1b0.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector
            (&local_1b0.m_options);
  local_1b0.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_1b0.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0],local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  local_2a0._0_8_ = &PTR__Opt_00153280;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  local_2a0._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
  }
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  local_90.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_90.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector(&local_90.m_options)
  ;
  local_90.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_90.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  local_460._0_8_ = &PTR__Opt_00153280;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_400);
  local_460._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_p != &local_410) {
    operator_delete(local_420._M_p,local_410._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_p != &local_430) {
    operator_delete(local_440._M_p,local_430._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  local_f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_f0.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector(&local_f0.m_options)
  ;
  local_f0.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_f0.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  local_358._0_8_ = &PTR__Opt_00153280;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  local_358._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_p != &local_308) {
    operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._32_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328) {
    operator_delete((void *)local_358._32_8_,local_328._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._24_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if (local_4e0[0] != local_4d0) {
    operator_delete(local_4e0[0],local_4d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  local_3e8._M_unused._M_object = &PTR__Opt_00153280;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_388);
  local_3e8._M_unused._M_object = &PTR__ParserRefImpl_00153450;
  if (_Stack_3a8._M_p != local_3a0 + 8) {
    operator_delete(_Stack_3a8._M_p,local_3a0._8_8_ + 1);
  }
  iVar13 = (int)local_670;
  if ((pointer *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_) !=
      (pointer *)
      ((long)&((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3c8)->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      + 0x10U)) {
    operator_delete((undefined1 *)CONCAT44(local_3c8._4_4_,local_3c8._0_4_),
                    aStack_3b8._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  clara::detail::Args::Args((Args *)&local_3e8,iVar13,local_678);
  clara::detail::ParserBase::parse
            ((InternalParseResult *)local_358,&local_150.super_ParserBase,(Args *)&local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_unused._0_8_ != &local_3d8) {
    operator_delete(local_3e8._M_unused._M_object,(ulong)(local_3d8._M_allocated_capacity + 1));
  }
  if (local_358._8_4_ != Optional) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error in command line: ",0x17);
    local_3e8._M_unused._M_object = &local_3d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e8,local_318._M_p,local_318._M_p + local_310);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_3e8._M_unused._0_8_,local_3e8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_unused._0_8_ != &local_3d8) {
      operator_delete(local_3e8._M_unused._M_object,(ulong)(local_3d8._M_allocated_capacity + 1));
    }
    iVar13 = -1;
    goto LAB_00107e7e;
  }
  if (local_68d == true) {
    iVar13 = 0;
    clara::detail::Parser::writeToStream(&local_150,(ostream *)&std::cout);
    goto LAB_00107e7e;
  }
  if (local_67c == 0 && (local_68c == 0 && local_688 == (_func_int *)0x0)) {
    local_688 = (_func_int *)0x186a0;
LAB_0010798d:
    local_68c = 60000;
  }
  else {
    if (local_67c != 0) {
      local_68c = local_68c + local_67c * 0x3c;
    }
    if ((local_688 == (_func_int *)0x0) && (local_68c != 0)) {
      local_688 = (_func_int *)0xe8d4a51000;
    }
    else if (local_68c == 0) goto LAB_0010798d;
  }
  lVar9 = std::chrono::_V2::system_clock::now();
  uVar14 = (ulong)local_68c;
  local_3d8._M_allocated_capacity = 0;
  local_3d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3e8._M_unused._M_object = (_func_int **)0x0;
  local_3e8._8_8_ = 0;
  local_3c8._8_8_ = (pointer)0x0;
  aStack_3b8._M_allocated_capacity = 0;
  aStack_3b8._8_8_ = (code *)0x0;
  _Stack_3a8._M_p = (pointer)0x0;
  local_3a0._0_8_ = (void *)0x0;
  local_3a0._8_8_ = 0;
  local_3a0._16_8_ = (code *)0x0;
  auStack_388._0_8_ = (pointer)0x0;
  auStack_388._8_8_ = (pointer)0x0;
  auStack_388._16_8_ = (pointer)0x0;
  local_370 = (_Manager_type)0x0;
  p_Stack_368 = (_Invoker_type)0x0;
  local_360 = 2000;
  local_35c = true;
  local_3c8[0] = false;
  local_3c8[1] = false;
  local_3c8[2] = false;
  local_3c8[3] = true;
  Jinx::Initialize((GlobalParams *)&local_3e8);
  Jinx::CreateRuntime();
  local_670 = (_func_int *)(uVar14 * 60000000000 + lVar9);
  lVar9 = 0;
  ppcVar11 = s_testScripts;
  iVar13 = 0;
  do {
    uVar5 = local_2a0._0_8_;
    pcVar1 = *ppcVar11;
    local_640[0] = local_630;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)local_640,
               "Test Script","");
    local_460._0_8_ = local_450;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)local_460,"core",
               "");
    (**(code **)*(_func_int **)uVar5)(local_228,uVar5,pcVar1,local_640,local_460,1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_450) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_460,
                 local_450._0_8_);
    }
    if (local_640[0] != local_630) {
      Jinx::MemFree(local_640[0],local_630[0] + 1);
    }
    if ((_func_int **)local_228._0_8_ == (_func_int **)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to compile test script #",0x1f);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      iVar13 = -1;
      cVar7 = '\0';
    }
    else {
      local_650 = (_func_int **)local_228._0_8_;
      local_648 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_228._8_8_ + 8) = *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_228._8_8_ + 8) = *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
        }
      }
      local_668 = std::any::_Manager_internal<std::nullptr_t>::_S_manage;
      local_660 = 0;
      (**(code **)(*(_func_int **)local_2a0._0_8_ + 8))
                (local_460,local_2a0._0_8_,&local_650,&local_668);
      if (local_668 != (code *)0x0) {
        (*local_668)(3,&local_668,0);
        local_668 = (code *)0x0;
      }
      if (local_648 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_648);
      }
      cVar7 = (**(code **)*(_func_int **)local_460._0_8_)();
      if (cVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to execute test script #",0x1f);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        iVar13 = -1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_460._8_8_);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
    }
    if (cVar7 == '\0') goto LAB_00107df0;
    lVar9 = lVar9 + 1;
    ppcVar11 = ppcVar11 + 1;
  } while (lVar9 != 0x21);
  local_450._0_8_ = (element_type *)0x0;
  local_460._0_8_ = local_460;
  local_460._8_8_ = local_460;
  iVar13 = std::thread::hardware_concurrency();
  local_678 = (char **)CONCAT44(local_678._4_4_,iVar13);
  PVar12._vptr_ParserBase = (_func_int **)local_460;
  if (0 < iVar13) {
    iVar13 = 0;
    do {
      uVar6 = local_2a0._8_8_;
      uVar5 = local_2a0._0_8_;
      p_Var4 = local_658;
      p_Var3 = local_688;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_2a0._8_8_ + 8) = *(_Atomic_word *)(local_2a0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_2a0._8_8_ + 8) = *(_Atomic_word *)(local_2a0._8_8_ + 8) + 1;
        }
      }
      local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
      local_228._0_8_ = operator_new(0x40);
      *(undefined ***)local_228._0_8_ = &PTR___State_impl_00153198;
      *(int *)(local_228._0_8_ + 8) = iVar13;
      *(_func_int **)(local_228._0_8_ + 0x10) = p_Var4;
      *(int *)(local_228._0_8_ + 0x18) = (int)local_678;
      *(_func_int **)(local_228._0_8_ + 0x20) = p_Var3;
      *(undefined8 *)(local_228._0_8_ + 0x28) = uVar5;
      *(undefined8 *)(local_228._0_8_ + 0x30) = uVar6;
      *(_func_int **)(local_228._0_8_ + 0x38) = local_670;
      std::thread::_M_start_thread(&local_1b0,local_228,0);
      if ((_func_int **)local_228._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_228._0_8_ + 8))();
      }
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)local_1b0.super_ParserBase._vptr_ParserBase;
      local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      local_450._0_8_ = (element_type *)((long)(_func_int ***)local_450._0_8_ + 1);
      if (local_1b0.super_ParserBase._vptr_ParserBase != (_func_int **)0x0) {
        std::terminate();
      }
      iVar13 = iVar13 + 1;
    } while ((int)local_678 != iVar13);
  }
  while (PVar12._vptr_ParserBase =
              (_func_int **)
              (((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
               PVar12._vptr_ParserBase)->_M_dataplus)._M_p,
        PVar12._vptr_ParserBase != (_func_int **)local_460) {
    std::thread::join();
  }
  std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear
            ((_List_base<std::thread,_std::allocator<std::thread>_> *)local_460);
  local_450._0_8_ = (element_type *)0x0;
  local_460._0_8_ = local_460;
  local_460._8_8_ = local_460;
  std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear
            ((_List_base<std::thread,_std::allocator<std::thread>_> *)local_460);
  iVar13 = 0;
LAB_00107df0:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
  }
  if (local_370 != (_Manager_type)0x0) {
    (*local_370)((_Any_data *)(auStack_388 + 8),(_Any_data *)(auStack_388 + 8),__destroy_functor);
  }
  if ((code *)local_3a0._16_8_ != (code *)0x0) {
    (*(code *)local_3a0._16_8_)(local_3a0,local_3a0,3);
  }
  if ((code *)aStack_3b8._8_8_ != (code *)0x0) {
    ppbVar2 = (pointer *)
              ((long)&((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8)->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              + 8);
    (*(code *)aStack_3b8._8_8_)(ppbVar2,ppbVar2,3);
  }
  if ((element_type *)local_3d8._M_allocated_capacity != (element_type *)0x0) {
    (*(code *)local_3d8._M_allocated_capacity)(&local_3e8,&local_3e8,3);
  }
LAB_00107e7e:
  local_358._0_8_ = &PTR__BasicResult_001534e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_p != &local_308) {
    operator_delete(local_318._M_p,local_308._M_allocated_capacity + 1);
  }
  local_358._0_8_ = &PTR__ResultValueBase_00153538;
  if (local_358._8_4_ == Optional) {
    std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
              ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
               (local_358 + 0x28));
  }
  local_150.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_150.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector
            (&local_150.m_options);
  local_150.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_150.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar13;
}

Assistant:

int main(int argc, char * argv[])
{
	// Handle command-line options
	uint64_t permutations = 0;
	uint64_t start = 0;
	uint32_t minutes = 0;
	uint32_t hours = 0;
	bool showHelp = false;
	auto parser =
		Opt(permutations, "permutations")["-p"]["--permutations"]("Max number of permutations to run") |
		Opt(start, "start")["-s"]["--start"]("Starting permutation") |
		Opt(minutes, "minutes")["-m"]["--minutes"]("Minutes to run fuzz tests") |
		Opt(hours, "hours")["-h"]["--hours"]("Hours to run fuzz tests") |
		Help(showHelp);

	auto result = parser.parse(Args(argc, argv));
	if (!result)
	{
		std::cerr << "Error in command line: " << result.errorMessage() << "\n";
		return -1;
	}
	else if (showHelp)
	{
		parser.writeToStream(std::cout);
		return 0;
	}

	// Set max permutations and/or time to run
	if (!permutations && !minutes && !hours)
	{
		// Pick a default number of permutations to run if no arguments are passed
		permutations = 100'000;

	}
	else
	{
		// Convert hours to minutes
		if (hours)
			minutes += (hours * 60);

		if (minutes)
		{
			// If permutation limit hasn't been specified
			if (!permutations)
				permutations = 1'000'000'000'000;
		}
	}

	if (!minutes)
	{
		// If time isn't specified, set max time to 1000 hours
		minutes = 60 * 1000;
	}

	// Start timer
	const auto startTime = std::chrono::system_clock::now();
	const auto stopTime = startTime + std::chrono::minutes(minutes);

	// Initialize Jinx and
	Jinx::GlobalParams globalParams;
	globalParams.logSymbols = false;
	globalParams.logBytecode = false;
	globalParams.enableLogging = false;
	Jinx::Initialize(globalParams);
	auto runtime = CreateRuntime();

	// Validate that all scripts compile and execute successfully
	for (auto i = 0u; i < std::size(s_testScripts); ++i)
	{
		// Compile the text to bytecode
		auto bytecode = runtime->Compile(s_testScripts[i], "Test Script", { "core" });
		if (!bytecode)
		{
			std::cerr << "Unable to compile test script #" << i << "\n";
			return -1;
		}

		// Create a runtime script with the given bytecode
		auto script = runtime->CreateScript(bytecode);
		
		if (!script->Execute())
		{
			std::cerr << "Unable to execute test script #" << i << "\n";
			return -1;
		}
	}

	std::list<std::thread> threadList;
	int numCores = std::thread::hardware_concurrency();
	for (int n = 0; n < numCores; ++n)
	{
		threadList.push_back(std::thread([n, start, numCores, permutations, runtime, stopTime]()
		{
			Fuzzer sourceFuzzer;
			for (uint64_t j = n; j < permutations; j += numCores)
			{
				if (std::chrono::system_clock::now() > stopTime)
					break;
				for (int i = 0; i < static_cast<int>(std::size(s_testScripts)); ++i)
				{
					// Compile the text to bytecode
					auto bytecode = runtime->Compile(sourceFuzzer.Fuzz(s_testScripts[i], j + start), "Test Script");
					if (!bytecode)
						continue;

					// Create and execute the script if viable
					auto script = runtime->CreateScript(bytecode);
					if (!script)
						continue;
					do
					{
						if (!script->Execute())
							break;
					}
					while (!script->IsFinished());
				}
				auto stats = Jinx::GetMemoryStats();
				printf("Permutation %" PRIu64 " (Allocated Memory = %" PRIu64 " KB)\n", j + start, stats.allocatedMemory / 1024);
			}
		}));
	}

	// Wait for all threads to finish
	for (auto & t : threadList)
		t.join();
	threadList.clear();

	return 0;
}